

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

void ghc::filesystem::permissions(path *p,perms prms,perm_options opts,error_code *ec)

{
  int iVar1;
  error_category *peVar2;
  error_code eVar3;
  file_status fs;
  perms local_2c;
  
  if ((opts & replace) == 0) {
    peVar2 = (error_category *)std::_V2::system_category();
    ec->_M_value = 0x16;
    ec->_M_cat = peVar2;
  }
  else {
    symlink_status((path *)&stack0xffffffffffffffd0,(error_code *)p);
    if ((opts & replace) != replace) {
      if ((opts & add) == 0) {
        prms = local_2c & ~prms;
      }
      else {
        prms = local_2c | prms;
      }
    }
    if (((opts & nofollow) == 0) &&
       (iVar1 = chmod((p->_path)._M_dataplus._M_p,(uint)prms), iVar1 != 0)) {
      eVar3 = detail::make_system_error(0);
      ec->_M_value = eVar3._M_value;
      ec->_M_cat = eVar3._M_cat;
    }
  }
  return;
}

Assistant:

GHC_INLINE void permissions(const path& p, perms prms, perm_options opts, std::error_code& ec)
{
    if (static_cast<int>(opts & (perm_options::replace | perm_options::add | perm_options::remove)) == 0) {
        ec = detail::make_error_code(detail::portable_error::invalid_argument);
        return;
    }
    auto fs = symlink_status(p, ec);
    if ((opts & perm_options::replace) != perm_options::replace) {
        if ((opts & perm_options::add) == perm_options::add) {
            prms = fs.permissions() | prms;
        }
        else {
            prms = fs.permissions() & ~prms;
        }
    }
#ifdef GHC_OS_WINDOWS
#ifdef __GNUC__
    auto oldAttr = GetFileAttributesW(p.wstring().c_str());
    if (oldAttr != INVALID_FILE_ATTRIBUTES) {
        DWORD newAttr = ((prms & perms::owner_write) == perms::owner_write) ? oldAttr & ~(static_cast<DWORD>(FILE_ATTRIBUTE_READONLY)) : oldAttr | FILE_ATTRIBUTE_READONLY;
        if (oldAttr == newAttr || SetFileAttributesW(p.wstring().c_str(), newAttr)) {
            return;
        }
    }
    ec = detail::make_system_error();
#else
    int mode = 0;
    if ((prms & perms::owner_read) == perms::owner_read) {
        mode |= _S_IREAD;
    }
    if ((prms & perms::owner_write) == perms::owner_write) {
        mode |= _S_IWRITE;
    }
    if (::_wchmod(p.wstring().c_str(), mode) != 0) {
        ec = detail::make_system_error();
    }
#endif
#else
    if ((opts & perm_options::nofollow) != perm_options::nofollow) {
        if (::chmod(p.c_str(), static_cast<mode_t>(prms)) != 0) {
            ec = detail::make_system_error();
        }
    }
#endif
}